

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::ProcessEdges
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,QueueEntry *entry)

{
  S2ShapeIndexCell *this_00;
  S2ShapeIndex *pSVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  S2ClippedShape *this_01;
  undefined4 extraout_var;
  int local_3c;
  int j;
  S2Shape *shape;
  S2ClippedShape *clipped;
  int s;
  S2ShapeIndexCell *index_cell;
  QueueEntry *entry_local;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  
  this_00 = entry->index_cell;
  clipped._4_4_ = 0;
  while( true ) {
    iVar2 = S2ShapeIndexCell::num_clipped(this_00);
    if (iVar2 <= clipped._4_4_) break;
    this_01 = S2ShapeIndexCell::clipped(this_00,clipped._4_4_);
    pSVar1 = this->index_;
    uVar3 = S2ClippedShape::shape_id(this_01);
    iVar2 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,(ulong)uVar3);
    local_3c = 0;
    while( true ) {
      iVar4 = S2ClippedShape::num_edges(this_01);
      if (iVar4 <= local_3c) break;
      iVar4 = S2ClippedShape::edge(this_01,local_3c);
      MaybeAddResult(this,(S2Shape *)CONCAT44(extraout_var,iVar2),iVar4);
      local_3c = local_3c + 1;
    }
    clipped._4_4_ = clipped._4_4_ + 1;
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::ProcessEdges(const QueueEntry& entry) {
  const S2ShapeIndexCell* index_cell = entry.index_cell;
  for (int s = 0; s < index_cell->num_clipped(); ++s) {
    const S2ClippedShape& clipped = index_cell->clipped(s);
    const S2Shape* shape = index_->shape(clipped.shape_id());
    for (int j = 0; j < clipped.num_edges(); ++j) {
      MaybeAddResult(*shape, clipped.edge(j));
    }
  }
}